

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

void MIR_append_insn(MIR_context_t ctx,MIR_item_t_conflict func_item,MIR_insn_t_conflict insn)

{
  MIR_error_func_t p_Var1;
  MIR_insn_t_conflict insn_local;
  MIR_item_t_conflict func_item_local;
  MIR_context_t ctx_local;
  
  if (func_item != (MIR_item_t_conflict)0x0) {
    if (func_item->item_type != MIR_func_item) {
      p_Var1 = MIR_get_error_func(ctx);
      (*p_Var1)(MIR_wrong_param_value_error,"MIR_append_insn: wrong func item");
    }
    DLIST_MIR_insn_t_append(&((func_item->u).func)->insns,insn);
    return;
  }
  __assert_fail("func_item != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                ,0xa62,"void MIR_append_insn(MIR_context_t, MIR_item_t, MIR_insn_t)");
}

Assistant:

void MIR_append_insn (MIR_context_t ctx, MIR_item_t func_item, MIR_insn_t insn) {
  mir_assert (func_item != NULL);
  if (func_item->item_type != MIR_func_item)
    MIR_get_error_func (ctx) (MIR_wrong_param_value_error, "MIR_append_insn: wrong func item");
  DLIST_APPEND (MIR_insn_t, func_item->u.func->insns, insn);
}